

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

bool Js::SimpleTypeHandler<1UL>::DoConvertToPathType(DynamicType *type)

{
  bool bVar1;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015aabd0,ShareCrossSiteFuncTypesPhase);
  if ((((!bVar1) ||
       (bVar1 = CrossSite::IsThunk((JavascriptMethod)(type->super_Type).entryPoint), !bVar1)) &&
      ((((type->typeHandler).ptr)->flags & 0x20) == 0)) &&
     ((bVar1 = Phases::IsEnabled((Phases *)&DAT_015a4e90,ShareFuncTypesPhase), !bVar1 ||
      ((type->super_Type).typeId != TypeIds_Function)))) {
    return true;
  }
  return false;
}

Assistant:

bool SimpleTypeHandler<size>::DoConvertToPathType(DynamicType* type)
    {
        if ((PHASE_ON1(ShareCrossSiteFuncTypesPhase) && CrossSite::IsThunk(type->GetEntryPoint())) || type->GetTypeHandler()->GetIsPrototype())
        {
            return false;
        }

        if (PHASE_OFF1(ShareFuncTypesPhase))
        {
            if (type->GetTypeId() == TypeIds_Function)
            {
                return false;
            }
        }

        return true;
    }